

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

cf_void_t cf_hashtbl_set(cf_hashtbl_t *self,cf_void_t *key,cf_size_t len,cf_void_t *value)

{
  hashtbl_node **pphVar1;
  byte bVar2;
  int iVar3;
  cf_size_t cVar4;
  hashtbl_node_t *__ptr;
  hashtbl_node_t *phVar5;
  hashtbl_node **pphVar6;
  hashtbl_node_t *phVar7;
  uint uVar8;
  
  if (value != (cf_void_t *)0x0) {
    phVar5 = hashtbl_get_node(self,key,len,1);
    if (phVar5 != (hashtbl_node_t *)0x0) {
      phVar5->value = value;
    }
    return;
  }
  if (len == 0xffffffffffffffff) {
    bVar2 = *key;
    if (bVar2 == 0) {
      uVar8 = 0;
      len = 1;
    }
    else {
      uVar8 = 0;
      len = 1;
      do {
        uVar8 = uVar8 * 0x21 + (uint)bVar2;
        bVar2 = *(byte *)((long)key + len);
        len = len + 1;
      } while (bVar2 != 0);
    }
  }
  else if (len == 0) {
    uVar8 = 0;
  }
  else {
    cVar4 = 0;
    uVar8 = 0;
    do {
      uVar8 = (uint)*(byte *)((long)key + cVar4) + uVar8 * 0x21;
      cVar4 = cVar4 + 1;
    } while (len != cVar4);
  }
  uVar8 = uVar8 & self->hashmsk;
  phVar5 = self->table[uVar8];
  if (phVar5 != (hashtbl_node_t *)0x0) {
    pphVar1 = self->table + uVar8;
    phVar7 = (hashtbl_node_t *)0x0;
    do {
      __ptr = phVar5;
      if ((((__ptr->hash == uVar8) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
         (iVar3 = bcmp(__ptr->key,key,len), iVar3 == 0)) {
        pphVar6 = &phVar7->next;
        if (*pphVar1 == __ptr) {
          pphVar6 = pphVar1;
        }
        *pphVar6 = __ptr->next;
        if (self->callback != (cf_hashtbl_cb_f)0x0) {
          (*self->callback)(__ptr->value);
        }
        free(__ptr->key);
        free(__ptr);
        self->size = self->size - 1;
        return;
      }
      phVar5 = __ptr->next;
      phVar7 = __ptr;
    } while (__ptr->next != (hashtbl_node *)0x0);
  }
  return;
}

Assistant:

cf_void_t cf_hashtbl_set(cf_hashtbl_t* self, const cf_void_t* key, cf_size_t len, cf_void_t* value) {
    hashtbl_node_t* node = CF_NULL_PTR;

    /* clear item */
    if (value == CF_NULL_PTR) {
        hashtbl_remove_node(self, key, len);
        return;
    }

    node = hashtbl_get_node(self, key, len, CF_TRUE);
    if (node) {
        node->value = value;
    }
}